

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

bool amrex::anon_unknown_12::is<amrex::IntVect>(string *str,IntVect *val)

{
  byte bVar1;
  ulong uVar2;
  string *in_RDI;
  string left;
  istringstream s;
  IntVect *in_stack_fffffffffffffe18;
  istream *in_stack_fffffffffffffe20;
  string *this;
  string local_1c8 [32];
  undefined4 local_1a8;
  istringstream local_198 [407];
  byte local_1;
  
  std::__cxx11::istringstream::istringstream(local_198,in_RDI,_S_in);
  amrex::operator>>(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    this = local_1c8;
    std::__cxx11::string::string(this);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_198,this);
    uVar2 = std::__cxx11::string::empty();
    local_1 = (uVar2 & 1) != 0;
    local_1a8 = 1;
    std::__cxx11::string::~string(local_1c8);
  }
  else {
    local_1 = 0;
    local_1a8 = 1;
  }
  std::__cxx11::istringstream::~istringstream(local_198);
  return (bool)(local_1 & 1);
}

Assistant:

bool
is (const std::string& str, T& val)
{
    std::istringstream s(str);
    s >> val;
    if ( s.fail() ) return false;
    std::string left;
    std::getline(s, left);
    if ( !left.empty() ) return false;
    return true;
}